

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_kmgmt.c
# Opt level: O0

int otherparams_to_params(EC_KEY *ec,OSSL_PARAM_BLD *tmpl,OSSL_PARAM *params)

{
  point_conversion_form_t id;
  int iVar1;
  uint uVar2;
  uint uVar3;
  OSSL_PARAM *pOVar4;
  EC_KEY *in_RDI;
  point_conversion_form_t format;
  char *name;
  int group_check;
  int ecdh_cofactor_mode;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar5;
  undefined4 uVar6;
  int local_4;
  
  uVar6 = 0;
  uVar5 = 0;
  if (in_RDI == (EC_KEY *)0x0) {
    local_4 = 0;
  }
  else {
    id = EC_KEY_get_conv_form(in_RDI);
    pOVar4 = (OSSL_PARAM *)ossl_ec_pt_format_id2name(id);
    if ((pOVar4 == (OSSL_PARAM *)0x0) ||
       (iVar1 = ossl_param_build_set_utf8_string
                          ((OSSL_PARAM_BLD *)CONCAT44(uVar6,uVar5),pOVar4,
                           (char *)CONCAT44(id,in_stack_ffffffffffffffc8),(char *)0x335cc0),
       iVar1 != 0)) {
      uVar2 = EC_KEY_get_flags(in_RDI);
      uVar2 = uVar2 & 0x6000;
      pOVar4 = (OSSL_PARAM *)ossl_ec_check_group_type_id2name(uVar2);
      if ((pOVar4 == (OSSL_PARAM *)0x0) ||
         (iVar1 = ossl_param_build_set_utf8_string
                            ((OSSL_PARAM_BLD *)CONCAT44(uVar6,uVar2),pOVar4,
                             (char *)CONCAT44(id,in_stack_ffffffffffffffc8),(char *)0x335d16),
         iVar1 != 0)) {
        uVar3 = EC_KEY_get_enc_flags(in_RDI);
        if (((uVar3 & 2) == 0) ||
           (iVar1 = ossl_param_build_set_int
                              ((OSSL_PARAM_BLD *)CONCAT44(uVar6,uVar2),pOVar4,
                               (char *)CONCAT44(id,in_stack_ffffffffffffffc8),0), iVar1 != 0)) {
          uVar3 = EC_KEY_get_flags(in_RDI);
          local_4 = ossl_param_build_set_int
                              ((OSSL_PARAM_BLD *)(ulong)CONCAT14((uVar3 & 0x1000) != 0,uVar2),pOVar4
                               ,(char *)CONCAT44(id,in_stack_ffffffffffffffc8),0);
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static ossl_inline
int otherparams_to_params(const EC_KEY *ec, OSSL_PARAM_BLD *tmpl,
                          OSSL_PARAM params[])
{
    int ecdh_cofactor_mode = 0, group_check = 0;
    const char *name = NULL;
    point_conversion_form_t format;

    if (ec == NULL)
        return 0;

    format = EC_KEY_get_conv_form(ec);
    name = ossl_ec_pt_format_id2name((int)format);
    if (name != NULL
        && !ossl_param_build_set_utf8_string(tmpl, params,
                                             OSSL_PKEY_PARAM_EC_POINT_CONVERSION_FORMAT,
                                             name))
        return 0;

    group_check = EC_KEY_get_flags(ec) & EC_FLAG_CHECK_NAMED_GROUP_MASK;
    name = ossl_ec_check_group_type_id2name(group_check);
    if (name != NULL
        && !ossl_param_build_set_utf8_string(tmpl, params,
                                             OSSL_PKEY_PARAM_EC_GROUP_CHECK_TYPE,
                                             name))
        return 0;

    if ((EC_KEY_get_enc_flags(ec) & EC_PKEY_NO_PUBKEY) != 0
            && !ossl_param_build_set_int(tmpl, params,
                                         OSSL_PKEY_PARAM_EC_INCLUDE_PUBLIC, 0))
        return 0;

    ecdh_cofactor_mode =
        (EC_KEY_get_flags(ec) & EC_FLAG_COFACTOR_ECDH) ? 1 : 0;
    return ossl_param_build_set_int(tmpl, params,
                                    OSSL_PKEY_PARAM_USE_COFACTOR_ECDH,
                                    ecdh_cofactor_mode);
}